

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nibbler.cpp
# Opt level: O1

bool __thiscall Nibbler::getRx(Nibbler *this,string *regex,string *result)

{
  size_type **ppsVar1;
  bool bVar2;
  int iVar3;
  long *plVar4;
  size_type **ppsVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  results;
  string modified_regex;
  RX r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  string local_c0;
  RX local_a0;
  
  if (this->_cursor < this->_length) {
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::substr((ulong)&local_a0,(ulong)regex);
    iVar3 = std::__cxx11::string::compare(&local_a0._compiled);
    ppsVar1 = (size_type **)&local_a0._pattern._M_string_length;
    if ((size_type **)local_a0._0_8_ != ppsVar1) {
      operator_delete((void *)local_a0._0_8_,local_a0._pattern._M_string_length + 1);
    }
    if (iVar3 == 0) {
      std::__cxx11::string::_M_assign((string *)&local_c0);
    }
    else {
      std::operator+(&local_f8,"^(",regex);
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
      ppsVar5 = (size_type **)(plVar4 + 2);
      if ((size_type **)*plVar4 == ppsVar5) {
        local_a0._pattern._M_string_length = (size_type)*ppsVar5;
        local_a0._pattern.field_2._M_allocated_capacity = plVar4[3];
        local_a0._0_8_ = ppsVar1;
      }
      else {
        local_a0._pattern._M_string_length = (size_type)*ppsVar5;
        local_a0._0_8_ = (size_type **)*plVar4;
      }
      local_a0._pattern._M_dataplus._M_p = (pointer)plVar4[1];
      *plVar4 = (long)ppsVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      std::__cxx11::string::operator=((string *)&local_c0,(string *)&local_a0);
      if ((size_type **)local_a0._0_8_ != ppsVar1) {
        operator_delete((void *)local_a0._0_8_,local_a0._pattern._M_string_length + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    RX::RX(&local_a0,&local_c0,true);
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::substr((ulong)&local_f8,(ulong)this);
    bVar2 = RX::match(&local_a0,&local_d8,&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)result);
      this->_cursor = this->_cursor + result->_M_string_length;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_d8);
    RX::~RX(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,
                      CONCAT71(local_c0.field_2._M_allocated_capacity._1_7_,
                               local_c0.field_2._M_local_buf[0]) + 1);
    }
    if (bVar2) {
      return true;
    }
  }
  return false;
}

Assistant:

bool Nibbler::getRx (const std::string& regex, std::string& result)
{
  if (_cursor < _length)
  {
    // Regex may be anchored to the beginning and include capturing parentheses,
    // otherwise they are added.
    std::string modified_regex;
    if (regex.substr (0, 2) != "^(")
      modified_regex = "^(" + regex + ")";
    else
      modified_regex = regex;

    RX r (modified_regex, true);
    std::vector <std::string> results;
    if (r.match (results, _input.substr (_cursor)))
    {
      result = results[0];
      _cursor += result.length ();
      return true;
    }
  }

  return false;
}